

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

Expression * __thiscall rsg::TexLookup::createNextChild(TexLookup *this,GeneratorState *state)

{
  Type TVar1;
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess CVar2;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess CVar3;
  ConstValueRangeAccess valueRange_01;
  ConstValueRangeAccess CVar4;
  ValueRangeAccess valueRange_02;
  ValueRangeAccess valueRange_03;
  bool bVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  deUint32 dVar10;
  deBool dVar11;
  Scalar *pSVar12;
  ExpressionSpec *pEVar13;
  Expression *pEVar14;
  int ndx;
  ulong uVar15;
  ulong uVar16;
  ValueRange lodRange;
  ValueRange *local_138;
  _Alloc_hider _Stack_130;
  Scalar *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  int iVar17;
  undefined4 in_stack_fffffffffffffef4;
  VariableType *pVVar18;
  ValueRange local_e8;
  TexLookup *local_68;
  ValueRange *local_60;
  Scalar *pSStack_58;
  Scalar *local_50;
  ValueRange *local_48;
  Scalar *pSStack_40;
  Scalar *local_38;
  
  TVar1 = this->m_type;
  if (((TVar1 < TYPE_LAST) && ((0x2aU >> (TVar1 & 0x1f) & 1) != 0)) &&
     (this->m_lodBiasExpr == (Expression *)0x0)) {
    _Stack_130._M_p = (pointer)&local_120;
    local_138 = (ValueRange *)0x1;
    local_128 = (Scalar *)0x0;
    local_120._M_local_buf[0] = '\0';
    iVar17 = 1;
    pVVar18 = (VariableType *)0x0;
    pSVar12 = (Scalar *)0x0;
    ValueRange::ValueRange(&local_e8,(VariableType *)&local_138);
    VariableType::~VariableType((VariableType *)&local_138);
    pSStack_40 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    if (local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_40 = (Scalar *)0x0;
    }
    local_38 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_38 = (Scalar *)0x0;
    }
    valueRange_02.super_ConstValueRangeAccess.m_type._4_4_ = in_stack_fffffffffffffef4;
    valueRange_02.super_ConstValueRangeAccess.m_type._0_4_ = iVar17;
    valueRange_02.super_ConstValueRangeAccess.m_min = (Scalar *)pVVar18;
    valueRange_02.super_ConstValueRangeAccess.m_max = pSVar12;
    local_48 = &local_e8;
    anon_unknown_0::setInfiniteRange(valueRange_02);
    _Stack_130._M_p =
         (pointer)local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      _Stack_130._M_p = (pointer)(Scalar *)0x0;
    }
    local_128 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start;
    if (local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_128 = (Scalar *)0x0;
    }
    valueRange.m_min = (Scalar *)_Stack_130._M_p;
    valueRange.m_type = &local_e8.m_type;
    valueRange.m_max = local_128;
    local_138 = &local_e8;
    pEVar13 = anon_unknown_0::chooseExpression
                        (state,(ExpressionSpec *)(anonymous_namespace)::s_expressionSpecs,0x1e,
                         valueRange);
    CVar2.m_min = (Scalar *)_Stack_130._M_p;
    CVar2.m_type = &local_138->m_type;
    CVar2.m_max = local_128;
    pEVar14 = (*pEVar13->create)(state,CVar2);
    this->m_lodBiasExpr = pEVar14;
    ValueRange::~ValueRange(&local_e8);
    return pEVar14;
  }
  if (this->m_coordExpr != (Expression *)0x0) {
    return (Expression *)0x0;
  }
  if (TVar1 - TYPE_TEXTURE2D_PROJ < 2) {
    iVar17 = 3;
    bVar5 = true;
  }
  else {
    if (TVar1 - TYPE_TEXTURECUBE < 2) {
      local_68 = this;
      dVar10 = deRandom_getUint32(&state->m_random->m_rnd);
      _Stack_130._M_p = (pointer)&local_120;
      local_138 = (ValueRange *)0x1;
      local_128 = (Scalar *)0x0;
      local_120._M_local_buf[0] = '\0';
      ValueRange::ValueRange(&local_e8,(VariableType *)&local_138);
      uVar16 = (ulong)(dVar10 % 3);
      VariableType::~VariableType((VariableType *)&local_138);
      uVar15 = 0;
      do {
        pSVar7 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pSVar6 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (uVar16 == uVar15) {
          dVar11 = deRandom_getBool(&state->m_random->m_rnd);
          pSVar7 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pSVar6 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          VariableType::getElementType(&local_e8.m_type);
          pSVar9 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pSVar8 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar12 = (Scalar *)0x0;
          if (pSVar6 != pSVar7) {
            pSVar12 = pSVar6;
          }
          pSVar12[uVar16] = *(Scalar *)(&DAT_00170840 + (ulong)(dVar11 == 1) * 4);
          VariableType::getElementType(&local_e8.m_type);
          pSVar12 = (Scalar *)0x0;
          if (pSVar8 != pSVar9) {
            pSVar12 = pSVar8;
          }
          pSVar12[uVar16] = *(Scalar *)(&DAT_00170848 + (ulong)(dVar11 == 1) * 4);
        }
        else {
          VariableType::getElementType(&local_e8.m_type);
          pSVar9 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pSVar8 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar12 = (Scalar *)0x0;
          if (pSVar6 != pSVar7) {
            pSVar12 = pSVar6;
          }
          pSVar12[uVar15].intVal = -0x40000000;
          VariableType::getElementType(&local_e8.m_type);
          pSVar12 = (Scalar *)0x0;
          if (pSVar8 != pSVar9) {
            pSVar12 = pSVar8;
          }
          pSVar12[uVar15].intVal = 0x40000000;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != 3);
      _Stack_130._M_p =
           (pointer)local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        _Stack_130._M_p = (pointer)(Scalar *)0x0;
      }
      local_128 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_128 = (Scalar *)0x0;
      }
      valueRange_00.m_min = (Scalar *)_Stack_130._M_p;
      valueRange_00.m_type = &local_e8.m_type;
      valueRange_00.m_max = local_128;
      local_138 = &local_e8;
      pEVar13 = anon_unknown_0::chooseExpression
                          (state,(ExpressionSpec *)(anonymous_namespace)::s_expressionSpecs,0x1e,
                           valueRange_00);
      CVar3.m_min = (Scalar *)_Stack_130._M_p;
      CVar3.m_type = &local_138->m_type;
      CVar3.m_max = local_128;
      pEVar14 = (*pEVar13->create)(state,CVar3);
      this = local_68;
      goto LAB_00141cf8;
    }
    iVar17 = 2;
    bVar5 = false;
  }
  _Stack_130._M_p = (pointer)&local_120;
  local_138 = (ValueRange *)0x1;
  local_128 = (Scalar *)0x0;
  local_120._M_local_buf[0] = '\0';
  pVVar18 = (VariableType *)0x0;
  pSVar12 = (Scalar *)0x0;
  ValueRange::ValueRange(&local_e8,(VariableType *)&local_138);
  VariableType::~VariableType((VariableType *)&local_138);
  pSStack_58 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSStack_58 = (Scalar *)0x0;
  }
  local_50 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50 = (Scalar *)0x0;
  }
  valueRange_03.super_ConstValueRangeAccess.m_type._4_4_ = in_stack_fffffffffffffef4;
  valueRange_03.super_ConstValueRangeAccess.m_type._0_4_ = iVar17;
  valueRange_03.super_ConstValueRangeAccess.m_min = (Scalar *)pVVar18;
  valueRange_03.super_ConstValueRangeAccess.m_max = pSVar12;
  local_60 = &local_e8;
  anon_unknown_0::setInfiniteRange(valueRange_03);
  if (bVar5) {
    dVar11 = deRandom_getBool(&state->m_random->m_rnd);
    pSVar7 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar6 = local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    VariableType::getElementType(&local_e8.m_type);
    pSVar9 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar8 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar12 = (Scalar *)0x0;
    if (pSVar6 != pSVar7) {
      pSVar12 = pSVar6;
    }
    pSVar12[2] = *(Scalar *)(&DAT_00170850 + (ulong)(dVar11 == 1) * 4);
    VariableType::getElementType(&local_e8.m_type);
    pSVar12 = (Scalar *)0x0;
    if (pSVar8 != pSVar9) {
      pSVar12 = pSVar8;
    }
    pSVar12[2] = *(Scalar *)(&DAT_00170858 + (ulong)(dVar11 == 1) * 4);
  }
  _Stack_130._M_p =
       (pointer)local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start;
  if (local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_e8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    _Stack_130._M_p = (pointer)(Scalar *)0x0;
  }
  local_128 = local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_e8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_128 = (Scalar *)0x0;
  }
  valueRange_01.m_min = (Scalar *)_Stack_130._M_p;
  valueRange_01.m_type = &local_e8.m_type;
  valueRange_01.m_max = local_128;
  local_138 = &local_e8;
  pEVar13 = anon_unknown_0::chooseExpression
                      (state,(ExpressionSpec *)(anonymous_namespace)::s_expressionSpecs,0x1e,
                       valueRange_01);
  CVar4.m_min = (Scalar *)_Stack_130._M_p;
  CVar4.m_type = &local_138->m_type;
  CVar4.m_max = local_128;
  pEVar14 = (*pEVar13->create)(state,CVar4);
LAB_00141cf8:
  this->m_coordExpr = pEVar14;
  ValueRange::~ValueRange(&local_e8);
  return this->m_coordExpr;
}

Assistant:

Expression* TexLookup::createNextChild (GeneratorState& state)
{
	bool hasLodBias		= m_type == TYPE_TEXTURE2D_LOD ||
						  m_type == TYPE_TEXTURE2D_PROJ_LOD ||
						  m_type == TYPE_TEXTURECUBE_LOD;

	if (hasLodBias && !m_lodBiasExpr)
	{
		ValueRange lodRange(VariableType(VariableType::TYPE_FLOAT, 1));
		setInfiniteRange(lodRange); // Any value is valid.

		m_lodBiasExpr = Expression::createRandom(state, lodRange.asAccess());
		return m_lodBiasExpr;
	}

	if (!m_coordExpr)
	{
		if (m_type == TYPE_TEXTURECUBE || m_type == TYPE_TEXTURECUBE_LOD)
		{
			// Make sure major axis selection can be done.
			int majorAxisNdx = state.getRandom().getInt(0, 2);

			ValueRange coordRange(VariableType(VariableType::TYPE_FLOAT, 3));

			for (int ndx = 0; ndx < 3; ndx++)
			{
				if (ndx == majorAxisNdx)
				{
					bool neg = state.getRandom().getBool();
					coordRange.getMin().component(ndx) = neg ? -4.0f	: 2.25f;
					coordRange.getMax().component(ndx) = neg ? -2.25f	: 4.0f;
				}
				else
				{
					coordRange.getMin().component(ndx) = -2.0f;
					coordRange.getMax().component(ndx) =  2.0f;
				}
			}

			m_coordExpr = Expression::createRandom(state, coordRange.asAccess());
		}
		else
		{
			bool	isProj				= m_type == TYPE_TEXTURE2D_PROJ || m_type == TYPE_TEXTURE2D_PROJ_LOD;
			int		coordScalarSize		= isProj ? 3 : 2;

			ValueRange coordRange(VariableType(VariableType::TYPE_FLOAT, coordScalarSize));
			setInfiniteRange(coordRange); // Initialize base range with -inf..inf

			if (isProj)
			{
				// w coordinate must be something sane, and not 0.
				bool neg = state.getRandom().getBool();
				coordRange.getMin().component(2) = neg ? -4.0f  : 0.25f;
				coordRange.getMax().component(2) = neg ? -0.25f : 4.0f;
			}

			m_coordExpr = Expression::createRandom(state, coordRange.asAccess());
		}

		DE_ASSERT(m_coordExpr);
		return m_coordExpr;
	}

	return DE_NULL; // Done.
}